

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUTF8Transcoder.hpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLUTF8Transcoder::checkTrailingBytes
          (XMLUTF8Transcoder *this,XMLByte toCheck,uint trailingBytes,uint position)

{
  UTFDataFormatException *this_00;
  char byte [2];
  char pos [2];
  char len [2];
  
  len[0] = (char)trailingBytes + '1';
  len[1] = '\0';
  pos[0] = (char)position + '1';
  pos[1] = '\0';
  byte[1] = '\0';
  byte[0] = toCheck;
  this_00 = (UTFDataFormatException *)__cxa_allocate_exception(0x30);
  UTFDataFormatException::UTFDataFormatException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUTF8Transcoder.hpp"
             ,0x6f,UTF8_FormatError,pos,byte,len,(char *)0x0,
             (this->super_XMLTranscoder).fMemoryManager);
  __cxa_throw(this_00,&UTFDataFormatException::typeinfo,XMLException::~XMLException);
}

Assistant:

inline 
void XMLUTF8Transcoder::checkTrailingBytes(const XMLByte      toCheck
                                          , const unsigned int trailingBytes
                                          , const unsigned int position) const
{

    if((toCheck & 0xC0) != 0x80) 
    {
        char len[2]  = {(char)(trailingBytes+0x31), 0};
        char pos[2]  = {(char)(position+0x31), 0};
        char byte[2] = {(char)toCheck,0};
        ThrowXMLwithMemMgr3(UTFDataFormatException, XMLExcepts::UTF8_FormatError, pos, byte, len, getMemoryManager());
    }

}